

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::ExecuteEchoColor
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  unsigned_long uVar5;
  undefined7 extraout_var;
  char *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *this;
  _Alloc_hider _Var6;
  char *c;
  _Alloc_hider _Var7;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view value_00;
  uint local_e8;
  bool local_e2;
  char local_e1;
  undefined4 local_e0;
  int count;
  string value;
  string fName;
  string progressDir;
  string local_70;
  string local_50;
  
  progressDir._M_dataplus._M_p = (pointer)&progressDir.field_2;
  progressDir._M_string_length = 0;
  progressDir.field_2._M_local_buf[0] = '\0';
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start + 2;
  local_e0 = (undefined4)CONCAT71((int7)((ulong)progressDir._M_dataplus._M_p >> 8),1);
  local_e2 = true;
  local_e8 = 0;
LAB_00188670:
  if (__lhs == pbVar1) {
    std::__cxx11::string::~string((string *)&progressDir);
    return 0;
  }
  str._M_str = (__lhs->_M_dataplus)._M_p;
  str._M_len = __lhs->_M_string_length;
  bVar2 = cmHasLiteralPrefix<10ul>(str,(char (*) [10])"--switch=");
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&value,(ulong)__lhs);
    if (value._M_string_length != 0) {
      value_00._M_str = extraout_RDX;
      value_00._M_len = (size_t)value._M_dataplus._M_p;
      local_e2 = cmValue::IsOn((cmValue *)value._M_string_length,value_00);
    }
    this = &value;
    goto LAB_00188916;
  }
  str_00._M_str = (__lhs->_M_dataplus)._M_p;
  str_00._M_len = __lhs->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_00,(char (*) [16])"--progress-dir=");
  if (bVar2) {
    this = &value;
    std::__cxx11::string::substr((ulong)this,(ulong)__lhs);
    std::__cxx11::string::operator=((string *)&progressDir,(string *)this);
    goto LAB_00188916;
  }
  str_01._M_str = (__lhs->_M_dataplus)._M_p;
  str_01._M_len = __lhs->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_01,(char (*) [16])"--progress-num=");
  if (bVar2) {
    if (progressDir._M_string_length == 0) goto LAB_0018891b;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)__lhs);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[10]>
              (&value,&progressDir,(char (*) [10])"/Progress");
    fName._M_string_length = 0;
    fName.field_2._M_local_buf[0] = '\0';
    fName._M_dataplus._M_p = (pointer)&fName.field_2;
    cmStrCat<std::__cxx11::string&,char_const(&)[11]>(&local_50,&value,(char (*) [11])"/count.txt");
    std::__cxx11::string::operator=((string *)&fName,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pFVar4 = (FILE *)cmsys::SystemTools::Fopen(&fName,"r");
    count = 0;
    if (pFVar4 != (FILE *)0x0) {
      iVar3 = __isoc99_fscanf(pFVar4,"%i",&count);
      if (iVar3 != 1) {
        std::operator<<((ostream *)&std::cerr,"Could not read from progress file.\n");
      }
      fclose(pFVar4);
      _Var6._M_p = local_70._M_dataplus._M_p;
      _Var7._M_p = local_70._M_dataplus._M_p;
      do {
        if ((*_Var7._M_p == ',') || (*_Var7._M_p == '\0')) {
          if (_Var7._M_p != _Var6._M_p) {
            local_e1 = '/';
            cmStrCat<std::__cxx11::string&,char>(&local_50,&value,&local_e1);
            std::__cxx11::string::operator=((string *)&fName,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::append((char *)&fName,(ulong)_Var6._M_p);
            pFVar4 = (FILE *)cmsys::SystemTools::Fopen(&fName,"w");
            if (pFVar4 != (FILE *)0x0) {
              fwrite("empty",5,1,pFVar4);
              fclose(pFVar4);
            }
          }
          if (*_Var7._M_p == '\0') goto LAB_001888bc;
          _Var6._M_p = _Var7._M_p + 1;
        }
        _Var7._M_p = _Var7._M_p + 1;
      } while( true );
    }
    goto LAB_001888ff;
  }
  bVar2 = std::operator==(__lhs,"--normal");
  if (bVar2) {
    local_e8 = 0;
  }
  else {
    bVar2 = std::operator==(__lhs,"--black");
    if (bVar2) {
      local_e8 = 1;
    }
    else {
      bVar2 = std::operator==(__lhs,"--red");
      if (bVar2) {
        local_e8 = 2;
      }
      else {
        bVar2 = std::operator==(__lhs,"--green");
        if (bVar2) {
          local_e8 = 3;
        }
        else {
          bVar2 = std::operator==(__lhs,"--yellow");
          if (bVar2) {
            local_e8 = 4;
          }
          else {
            bVar2 = std::operator==(__lhs,"--blue");
            if (bVar2) {
              local_e8 = 5;
            }
            else {
              bVar2 = std::operator==(__lhs,"--magenta");
              if (bVar2) {
                local_e8 = 6;
              }
              else {
                bVar2 = std::operator==(__lhs,"--cyan");
                if (bVar2) {
                  local_e8 = 7;
                }
                else {
                  bVar2 = std::operator==(__lhs,"--white");
                  if (bVar2) {
                    local_e8 = 8;
                  }
                  else {
                    bVar2 = std::operator==(__lhs,"--bold");
                    if (bVar2) {
                      local_e8 = local_e8 | 0x100;
                    }
                    else {
                      bVar2 = std::operator==(__lhs,"--no-newline");
                      if (bVar2) {
                        local_e0 = 0;
                      }
                      else {
                        bVar2 = std::operator==(__lhs,"--newline");
                        if (bVar2) {
                          local_e0 = (undefined4)CONCAT71(extraout_var,1);
                        }
                        else {
                          cmSystemTools::MakefileColorEcho
                                    (local_e8,(__lhs->_M_dataplus)._M_p,(bool)((byte)local_e0 & 1),
                                     local_e2);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0018891b;
LAB_001888bc:
  uVar5 = cmsys::Directory::GetNumberOfFilesInDirectory(&value,(string *)0x0);
  if (0 < count) {
    fprintf(_stdout,"[%3i%%] ",(long)((int)uVar5 * 100 + -300) / (long)count & 0xffffffff);
  }
LAB_001888ff:
  std::__cxx11::string::~string((string *)&fName);
  std::__cxx11::string::~string((string *)&value);
  this = &local_70;
LAB_00188916:
  std::__cxx11::string::~string((string *)this);
LAB_0018891b:
  __lhs = __lhs + 1;
  goto LAB_00188670;
}

Assistant:

void cmCatFile(const std::string& fileToAppend)
{
#ifdef _WIN32
  _setmode(fileno(stdin), _O_BINARY);
  _setmode(fileno(stdout), _O_BINARY);
#endif
  std::streambuf* buf = std::cin.rdbuf();
  cmsys::ifstream source;
  if (fileToAppend != "-") {
    source.open(fileToAppend.c_str(), (std::ios::binary | std::ios::in));
    buf = source.rdbuf();
  }
  std::cout << buf;
}